

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O0

void __thiscall CTcTokenizer::splice_string(CTcTokenizer *this)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  wchar_t wVar4;
  wchar_t wVar5;
  size_t sVar6;
  char *pcVar7;
  CTcTokenizer *str;
  CTcTokenizer *pCVar8;
  size_t __n;
  long in_RDI;
  int qcnt_1;
  int qcnt;
  wchar_t cur;
  size_t new_len;
  size_t rem;
  char *new_line_p;
  int new_line_ofs;
  utf8_ptr p;
  int explicit_nl;
  int in_triple;
  wchar_t in_quote;
  char unterm;
  char *in_stack_ffffffffffffff78;
  utf8_ptr *in_stack_ffffffffffffff80;
  utf8_ptr *in_stack_ffffffffffffff88;
  CTcTokenizer *in_stack_ffffffffffffff90;
  bool local_5d;
  bool local_4d;
  int in_stack_ffffffffffffffb8;
  wchar_t in_stack_ffffffffffffffbc;
  CTcTokenizer *in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffe4;
  int iVar9;
  char local_9;
  
  local_9 = '\0';
  wVar5 = *(wchar_t *)(in_RDI + 0x120);
  iVar9 = *(int *)(in_RDI + 0x124);
  sVar6 = CTcTokString::get_text_len((CTcTokString *)(in_RDI + 0xa0));
  local_4d = false;
  if (1 < sVar6) {
    pcVar7 = CTcTokString::get_text_end((CTcTokString *)(in_RDI + 0xa0));
    local_4d = *(short *)(pcVar7 + -2) == 0x6e5c;
  }
  uVar1 = (uint)local_4d;
  utf8_ptr::utf8_ptr(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
LAB_00295807:
  iVar2 = *(int *)(in_RDI + 4);
  if (iVar2 != 0) {
    if (iVar2 == 1) {
      if (uVar1 == 0) {
        CTcTokString::append
                  ((CTcTokString *)in_stack_ffffffffffffff90,(char *)in_stack_ffffffffffffff88,
                   (size_t)in_stack_ffffffffffffff80);
      }
    }
    else if (iVar2 == 2) {
      CTcTokString::append
                ((CTcTokString *)in_stack_ffffffffffffff90,(char *)in_stack_ffffffffffffff88,
                 (size_t)in_stack_ffffffffffffff80);
    }
  }
  iVar2 = read_line((CTcTokenizer *)CONCAT44(iVar9,uVar1),in_stack_ffffffffffffffe4);
  if (iVar2 == -1) goto LAB_00295c6c;
  pcVar7 = CTcTokString::get_text((CTcTokString *)(in_RDI + 0xa0));
  str = (CTcTokenizer *)(pcVar7 + iVar2);
  utf8_ptr::set((utf8_ptr *)&stack0xffffffffffffffe0,(char *)str);
  if ((*(int *)(in_RDI + 4) != 2) && (uVar1 == 0)) {
    while( true ) {
      utf8_ptr::getch((utf8_ptr *)0x2958de);
      iVar3 = is_space(L'\0');
      if (iVar3 == 0) break;
      utf8_ptr::inc(in_stack_ffffffffffffff80);
    }
  }
  sVar6 = CTcTokString::get_text_len((CTcTokString *)(in_RDI + 0xa0));
  local_5d = false;
  if (1 < sVar6 - (long)iVar2) {
    pcVar7 = CTcTokString::get_text_end((CTcTokString *)(in_RDI + 0xa0));
    local_5d = *(short *)(pcVar7 + -2) == 0x6e5c;
  }
  uVar1 = (uint)local_5d;
  pCVar8 = (CTcTokenizer *)utf8_ptr::getptr((utf8_ptr *)&stack0xffffffffffffffe0);
  if (str < pCVar8) {
    in_stack_ffffffffffffff88 =
         (utf8_ptr *)CTcTokString::get_text_len((CTcTokString *)(in_RDI + 0xa0));
    in_stack_ffffffffffffff80 = (utf8_ptr *)utf8_ptr::getptr((utf8_ptr *)&stack0xffffffffffffffe0);
    pcVar7 = CTcTokString::get_buf((CTcTokString *)(in_RDI + 0xa0));
    __n = (long)in_stack_ffffffffffffff88 - ((long)in_stack_ffffffffffffff80 - (long)pcVar7);
    in_stack_ffffffffffffff90 = str;
    pcVar7 = CTcTokString::get_buf((CTcTokString *)(in_RDI + 0xa0));
    in_stack_ffffffffffffffc0 =
         (CTcTokenizer *)((long)in_stack_ffffffffffffff90 + (__n - (long)pcVar7));
    pcVar7 = utf8_ptr::getptr((utf8_ptr *)&stack0xffffffffffffffe0);
    memmove(str,pcVar7,__n);
    CTcTokString::set_text_len((CTcTokString *)(in_RDI + 0xa0),(size_t)in_stack_ffffffffffffffc0);
  }
  utf8_ptr::set((utf8_ptr *)&stack0xffffffffffffffe0,(char *)str);
  wVar4 = utf8_ptr::getch((utf8_ptr *)0x295a43);
  if ((wVar4 == L'}') || (wVar4 = utf8_ptr::getch((utf8_ptr *)0x295a52), wVar4 == L';')) {
    utf8_ptr::inc(in_stack_ffffffffffffff80);
    while( true ) {
      utf8_ptr::getch((utf8_ptr *)0x295a6f);
      iVar2 = is_space(L'\0');
      if (iVar2 == 0) break;
      utf8_ptr::inc(in_stack_ffffffffffffff80);
    }
    wVar4 = utf8_ptr::getch((utf8_ptr *)0x295a93);
    if (wVar4 == L'\0') {
      log_error(0x2743,*(undefined8 *)(in_RDI + 0x50));
      local_9 = (char)wVar5;
      *(undefined4 *)(in_RDI + 0x120) = 0;
      CTcTokString::get_buf((CTcTokString *)(in_RDI + 0xa0));
      process_comments(in_stack_ffffffffffffffc0,
                       CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
      utf8_ptr::set((utf8_ptr *)&stack0xffffffffffffffe0,(char *)str);
LAB_00295c6c:
      pcVar7 = utf8_ptr::getptr((utf8_ptr *)&stack0xffffffffffffffe0);
      if (pcVar7 != (char *)0x0) {
        utf8_ptr::getptr((utf8_ptr *)&stack0xffffffffffffffe0);
        unsplice_line(in_stack_ffffffffffffffc0,
                      (char *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
      }
      if (local_9 != '\0') {
        CTcTokString::append
                  ((CTcTokString *)in_stack_ffffffffffffff90,(char *)in_stack_ffffffffffffff88,
                   (size_t)in_stack_ffffffffffffff80);
      }
      return;
    }
  }
  utf8_ptr::set((utf8_ptr *)&stack0xffffffffffffffe0,(char *)str);
  do {
    in_stack_ffffffffffffffbc = utf8_ptr::getch((utf8_ptr *)0x295b19);
    if (in_stack_ffffffffffffffbc == L'\\') {
      utf8_ptr::inc(in_stack_ffffffffffffff80);
      if ((iVar9 == 0) || (wVar4 = utf8_ptr::getch((utf8_ptr *)0x295b43), wVar4 != wVar5)) {
        wVar4 = utf8_ptr::getch((utf8_ptr *)0x295b7b);
        if (wVar4 == L'<') {
          while (wVar4 = utf8_ptr::getch((utf8_ptr *)0x295b8c), wVar4 == L'<') {
            utf8_ptr::inc(in_stack_ffffffffffffff80);
          }
        }
      }
      else {
        in_stack_ffffffffffffffb8 =
             count_quotes(in_stack_ffffffffffffff80,
                          (wchar_t)((ulong)in_stack_ffffffffffffff78 >> 0x20));
        utf8_ptr::inc_by(in_stack_ffffffffffffff80,(size_t)in_stack_ffffffffffffff78);
      }
    }
    else if (in_stack_ffffffffffffffbc == wVar5) {
      if (iVar9 == 0) {
        utf8_ptr::inc(in_stack_ffffffffffffff80);
        goto LAB_00295c6c;
      }
      iVar2 = count_quotes(in_stack_ffffffffffffff80,
                           (wchar_t)((ulong)in_stack_ffffffffffffff78 >> 0x20));
      if (2 < iVar2) {
        utf8_ptr::inc_by(in_stack_ffffffffffffff80,(size_t)in_stack_ffffffffffffff78);
        goto LAB_00295c6c;
      }
    }
    else {
      if ((in_stack_ffffffffffffffbc == L'<') &&
         (wVar4 = utf8_ptr::getch_at(in_stack_ffffffffffffff80,(size_t)in_stack_ffffffffffffff78),
         wVar4 == L'<')) {
        utf8_ptr::inc(in_stack_ffffffffffffff80);
        utf8_ptr::inc(in_stack_ffffffffffffff80);
        wVar5 = utf8_ptr::getch((utf8_ptr *)0x295c2f);
        if (wVar5 == L'%') {
          scan_sprintf_spec(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
        }
        goto LAB_00295c6c;
      }
      if (in_stack_ffffffffffffffbc == L'\0') break;
    }
    utf8_ptr::inc(in_stack_ffffffffffffff80);
  } while( true );
  in_stack_ffffffffffffffbc = L'\0';
  goto LAB_00295807;
}

Assistant:

void CTcTokenizer::splice_string()
{
    /* presume we'll find proper termination */
    char unterm = '\0';

    /* 
     *   remember the current in-quote and in-embedding status, as of the
     *   end of the current line - when we splice, the line reader will
     *   update these to the status at the end of the newly-read material,
     *   but we want to scan from the beginning of the newly-read material 
     */
    wchar_t in_quote = in_quote_;
    int in_triple = in_triple_;

    /* note if the previous line ended with an explicit \n sequence */
    int explicit_nl = (linebuf_.get_text_len() >= 2
                       && memcmp(linebuf_.get_text_end() - 2, "\\n", 2) == 0);
        
    /* keep going until we find the end of the string */
    utf8_ptr p((char *)0);
    for (;;)
    {
        /* apply the newline spacing mode */
        switch (string_newline_spacing_)
        {
        case NEWLINE_SPACING_COLLAPSE:
            /* 
             *   Replace the newline and any subsequent run of whitespace
             *   characters with a single space, unless the last line ended
             *   with an explicit newline.
             */
            if (!explicit_nl)
                linebuf_.append(" ", 1);
            break;

        case NEWLINE_SPACING_DELETE:
            /* delete the newline and subsequent whitespace */
            break;

        case NEWLINE_SPACING_PRESERVE:
            /* 
             *   preserve the newline and subsequent whitespace exactly as
             *   written in the source code, so convert the newline to an
             *   explicit \n sequence (in source form, since we're building a
             *   source line at this point)
             */
            linebuf_.append("\\n", 2);
            break;
        }

        /* splice another line */
        int new_line_ofs = read_line(TRUE);

        /* if we reached end of file, there's no more splicing we can do */
        if (new_line_ofs == -1)
            break;

        /* get a pointer to the new text */
        char *new_line_p = (char *)linebuf_.get_text() + new_line_ofs;
        p.set(new_line_p);

        /* 
         *   If we're in COLLAPSE or DELETE mode for newline spacing, skip
         *   leading spaces in the new line.  However, override this if the
         *   previous line ended with an explicit \n sequence; this tells us
         *   that the line break is explicitly part of the string and that
         *   the subsequent whitespace is to be preserved.
         */
        if (string_newline_spacing_ != NEWLINE_SPACING_PRESERVE
            && !explicit_nl)
            for ( ; is_space(p.getch()) ; p.inc()) ;

        /* check to see if the newly spliced text ends in an explicit \n */
        explicit_nl = (linebuf_.get_text_len() - new_line_ofs >= 2
                       && memcmp(linebuf_.get_text_end() - 2, "\\n", 2) == 0);

        /* if we skipped any spaces, remove them from the text */
        if (p.getptr() > new_line_p)
        {
            /* calculate the length of the rest of the line */
            size_t rem = linebuf_.get_text_len()
                         - (p.getptr() - linebuf_.get_buf());

            /* calculate the new length of the line */
            size_t new_len = (new_line_p - linebuf_.get_buf()) + rem;

            /* move the rest of the line down over the spaces */
            memmove(new_line_p, p.getptr(), rem);

            /* set the new length */
            linebuf_.set_text_len(new_len);
        }

        /* 
         *   If the new line contains only "}" or ";", presume that the
         *   string is unterminated and terminate it here.  (This
         *   heuristic could flag well-formed strings as erroneous, but
         *   users can always work around this by moving these characters
         *   onto lines that contain at least one other non-whitespace
         *   character.)  
         */
        p.set(new_line_p);
        if (p.getch() == '}' || p.getch() == ';')
        {
            /* skip trailing whitespace */
            for (p.inc() ; is_space(p.getch()) ; p.inc()) ;
            
            /* 
             *   if there's nothing else on the line, presume it's an
             *   unterminated string 
             */
            if (p.getch() == '\0')
            {
                /* log the error */
                log_error(TCERR_POSSIBLE_UNTERM_STR,
                          appended_linenum_);

                /* remember that it's unterminated */
                unterm = (char)in_quote;

                /* 
                 *   since we're adding a presumed close quote that never
                 *   appears in the text, we need to figure the new
                 *   in-string status for the line; clear the in-quote
                 *   flag, and re-scan comments from the current point on
                 *   the line 
                 */
                in_quote_ = '\0';
                process_comments(new_line_p - linebuf_.get_buf());

                /* we're done - unsplice from the start of the new line */
                p.set(new_line_p);
                goto done;
            }
        }

        /* scan for the end of the string */
        for (p.set(new_line_p) ; ; p.inc())
        {
            /* get this character */
            wchar_t cur = p.getch();

            /* see what we have */
            if (cur == '\\')
            {
                /* it's a backslash sequence - skip the extra character */
                p.inc();

                /* 
                 *   in a triple-quoted string, a backslash escapes a whole
                 *   run of consecutive quote characters 
                 */
                if (in_triple && p.getch() == in_quote)
                {
                    /* skip all but the last consecutive quote */
                    int qcnt = count_quotes(&p, in_quote);
                    p.inc_by(qcnt - 1);
                }
                else if (p.getch() == '<')
                {
                    /* skip a run of <'s */
                    for ( ; p.getch() == '<' ; p.inc()) ;
                }
            }
            else if (cur == in_quote)
            {
                /* it's our quote character - check for triple quotes */
                if (in_triple)
                {
                    /* in a triple-quoted string - we need 3+ to end it */
                    int qcnt = count_quotes(&p, cur);
                    if (qcnt >= 3)
                    {
                        /* we have at least 3 - skip them and exit */
                        p.inc_by(qcnt);
                        goto done;
                    }
                }
                else
                {
                    /* regular string - skip it and exit the string */
                    p.inc();
                    goto done;
                }
            }
            else if (cur == '<' && p.getch_at(1) == '<')
            {
                /* 
                 *   it's an embedded expression starter - skip the '<<'
                 *   sequence and stop scanning 
                 */
                p.inc();
                p.inc();

                /* check for a '%' sprintf code */
                if (p.getch() == '%')
                    scan_sprintf_spec(&p);

                /* done */
                goto done;
            }
            else if (cur == '\0')
            {
                /* end of line - go back and splice another line */
                break;
            }
        }
    }

done:
    /* if we actually spliced anything, unsplice it at the current point */
    if (p.getptr() != 0)
        unsplice_line(p.getptr());

    /* if we found an unterminated string, supply implicit termination */
    if (unterm != '\0')
        linebuf_.append(&unterm, 1);
}